

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::HandleInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  uint64_t uVar1;
  undefined4 uVar2;
  Result RVar3;
  Enum extraout_EAX;
  uint32_t *out_offset;
  
  if (this->in_data_section_ == true) {
    *(undefined8 *)((long)&(this->data_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar2 = *(undefined4 *)&expr->field_0x4;
    uVar1 = (expr->value).i64;
    (this->data_init_expr_).type = expr->type;
    *(undefined4 *)&(this->data_init_expr_).field_0x4 = uVar2;
    (this->data_init_expr_).value.i64 = uVar1;
    out_offset = &this->data_offset_;
  }
  else {
    if (this->in_elem_section_ != true) {
      PrintInitExpr(this,expr);
      return (Result)extraout_EAX;
    }
    *(undefined8 *)((long)&(this->elem_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    uVar2 = *(undefined4 *)&expr->field_0x4;
    uVar1 = (expr->value).i64;
    (this->elem_init_expr_).type = expr->type;
    *(undefined4 *)&(this->elem_init_expr_).field_0x4 = uVar2;
    (this->elem_init_expr_).value.i64 = uVar1;
    out_offset = &this->elem_offset_;
  }
  RVar3 = InitExprToConstOffset(expr,out_offset);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderObjdump::HandleInitExpr(const InitExpr& expr) {
  if (in_data_section_) {
    data_init_expr_ = expr;
    return InitExprToConstOffset(expr, &data_offset_);
  } else if (in_elem_section_) {
    elem_init_expr_ = expr;
    return InitExprToConstOffset(expr, &elem_offset_);
  } else {
    PrintInitExpr(expr);
  }
  return Result::Ok;
}